

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.hpp
# Opt level: O3

bool __thiscall sglr::rc::Texture1D::isComplete(Texture1D *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  TextureFormat *format;
  size_t *psVar6;
  uint uVar7;
  uint uVar8;
  IVec3 *pIVar9;
  uint uVar10;
  
  uVar1 = (this->super_Texture).m_baseLevel;
  uVar4 = (ulong)uVar1;
  if ((0xd < uVar4) || ((this->m_levels).m_data[uVar4].m_cap == 0)) {
    return false;
  }
  if (LINEAR < (this->super_Texture).m_sampler.minFilter) {
    uVar2 = (this->m_levels).m_access[uVar4].super_ConstPixelBufferAccess.m_size.m_data[0];
    uVar7 = ((this->super_Texture).m_maxLevel - uVar1) + 1;
    uVar10 = 0x20;
    if (uVar2 != 0) {
      uVar10 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar10 == 0; uVar10 = uVar10 - 1) {
        }
      }
      uVar10 = uVar10 ^ 0x1f;
    }
    uVar8 = 0x20 - uVar10;
    if ((int)uVar7 < (int)(0x20 - uVar10)) {
      uVar8 = uVar7;
    }
    if (1 < (int)uVar8) {
      pIVar9 = &(this->m_levels).m_access[uVar4 + 1].super_ConstPixelBufferAccess.m_size;
      psVar6 = &(this->m_levels).m_data[uVar4 + 1].m_cap;
      uVar5 = 1;
      while( true ) {
        if ((0xe - uVar1 == uVar5) || (*psVar6 == 0)) {
          return false;
        }
        iVar3 = (int)uVar2 >> ((byte)uVar5 & 0x1f);
        if (iVar3 < 2) {
          iVar3 = 1;
        }
        if (pIVar9->m_data[0] != iVar3) break;
        if (*(ChannelOrder *)((long)(pIVar9 + -1) + 4) !=
            (this->m_levels).m_access[uVar4].super_ConstPixelBufferAccess.m_format.order) {
          return false;
        }
        if (*(ChannelType *)((long)(pIVar9 + -1) + 8) !=
            (this->m_levels).m_access[uVar4].super_ConstPixelBufferAccess.m_format.type) {
          return false;
        }
        uVar5 = uVar5 + 1;
        pIVar9 = (IVec3 *)((long)(pIVar9 + 3) + 4);
        psVar6 = psVar6 + 2;
        if (uVar8 == uVar5) {
          return true;
        }
      }
      return false;
    }
  }
  return true;
}

Assistant:

int							getMaxLevel		(void) const	{ return m_maxLevel;		}